

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O3

IRet * __thiscall
vkt::shaderexecutor::
DerivedFunc<vkt::shaderexecutor::Signature<tcu::Matrix<float,_2,_2>,_tcu::Matrix<float,_2,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
::doApply(IRet *__return_storage_ptr__,
         DerivedFunc<vkt::shaderexecutor::Signature<tcu::Matrix<float,_2,_2>,_tcu::Matrix<float,_2,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
         *this,EvalContext *ctx,IArgs *args)

{
  long *plVar1;
  Expr<tcu::Matrix<float,_2,_2>_> *pEVar2;
  Matrix<tcu::Interval,_2,_2> *pMVar3;
  double dVar4;
  Vector<tcu::Interval,_2> *pVVar5;
  Vector<tcu::Interval,_2> *pVVar6;
  undefined7 uVar7;
  pointer pSVar8;
  IVal *pIVar9;
  ulong uVar10;
  long lVar11;
  Environment funEnv;
  EvalContext funCtx;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  _Stack_108;
  int local_d8;
  int iStack_d4;
  int iStack_d0;
  YesNoMaybe YStack_cc;
  undefined8 local_c8;
  undefined8 uStack_c0;
  double local_b8;
  Precision local_b0;
  undefined1 *local_a8;
  int local_a0;
  undefined8 local_90;
  double dStack_88;
  double local_80;
  undefined8 local_78;
  double dStack_70;
  double local_68;
  undefined8 local_60;
  double dStack_58;
  double local_50;
  undefined8 local_48;
  double dStack_40;
  double local_38;
  
  _Stack_108._M_impl.super__Rb_tree_header._M_header._M_left =
       &_Stack_108._M_impl.super__Rb_tree_header._M_header;
  _Stack_108._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  _Stack_108._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  _Stack_108._M_impl.super__Rb_tree_header._M_node_count = 0;
  _Stack_108._M_impl.super__Rb_tree_header._M_header._M_right =
       _Stack_108._M_impl.super__Rb_tree_header._M_header._M_left;
  tcu::Matrix<tcu::Interval,_2,_2>::Matrix(__return_storage_ptr__);
  initialize(this);
  Environment::bind<tcu::Matrix<float,2,2>>
            ((Environment *)&_Stack_108,
             (this->m_var0).
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_2>_>_>.m_ptr,
             args->a);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&_Stack_108,
             (this->m_var1).
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             args->b);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&_Stack_108,
             (this->m_var2).
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             args->c);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&_Stack_108,
             (this->m_var3).
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             args->d);
  local_b0 = ctx->floatPrecision;
  local_a0 = ctx->callDepth;
  local_b8 = (ctx->format).m_maxValue;
  local_d8 = (ctx->format).m_minExp;
  iStack_d4 = (ctx->format).m_maxExp;
  iStack_d0 = (ctx->format).m_fractionBits;
  YStack_cc = (ctx->format).m_hasSubnormal;
  local_c8._0_4_ = (ctx->format).m_hasInf;
  local_c8._4_4_ = (ctx->format).m_hasNaN;
  uStack_c0 = *(undefined8 *)&(ctx->format).m_exactPrecision;
  pSVar8 = (this->m_body).
           super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_a8 = (undefined1 *)&_Stack_108;
  if ((this->m_body).
      super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
      ._M_impl.super__Vector_impl_data._M_finish != pSVar8) {
    lVar11 = 0;
    uVar10 = 0;
    local_a8 = (undefined1 *)&_Stack_108;
    do {
      plVar1 = *(long **)((long)&(pSVar8->super_SharedPtr<const_vkt::shaderexecutor::Statement>).
                                 m_ptr + lVar11);
      (**(code **)(*plVar1 + 0x18))(plVar1,&local_d8);
      uVar10 = uVar10 + 1;
      pSVar8 = (this->m_body).
               super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar11 = lVar11 + 0x10;
    } while (uVar10 < (ulong)((long)(this->m_body).
                                    super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar8 >> 4))
    ;
  }
  pEVar2 = (this->m_ret).super_ContainerExprPBase<tcu::Matrix<float,_2,_2>_>.
           super_ExprPBase<tcu::Matrix<float,_2,_2>_>.
           super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_2,_2>_>_>.m_ptr;
  (*(pEVar2->super_ExprBase)._vptr_ExprBase[4])(&local_90,pEVar2,&local_d8);
  (__return_storage_ptr__->m_data).m_data[0].m_data[0].m_hi = local_80;
  *(undefined8 *)(__return_storage_ptr__->m_data).m_data[0].m_data = local_90;
  (__return_storage_ptr__->m_data).m_data[0].m_data[0].m_lo = dStack_88;
  (__return_storage_ptr__->m_data).m_data[1].m_data[0].m_hi = local_50;
  *(undefined8 *)(__return_storage_ptr__->m_data).m_data[1].m_data = local_60;
  (__return_storage_ptr__->m_data).m_data[1].m_data[0].m_lo = dStack_58;
  *(undefined8 *)((__return_storage_ptr__->m_data).m_data[0].m_data + 1) = local_78;
  (__return_storage_ptr__->m_data).m_data[0].m_data[1].m_lo = dStack_70;
  (__return_storage_ptr__->m_data).m_data[0].m_data[1].m_hi = local_68;
  *(undefined8 *)((__return_storage_ptr__->m_data).m_data[1].m_data + 1) = local_48;
  (__return_storage_ptr__->m_data).m_data[1].m_data[1].m_lo = dStack_40;
  (__return_storage_ptr__->m_data).m_data[1].m_data[1].m_hi = local_38;
  pIVar9 = Environment::lookup<tcu::Matrix<float,2,2>>
                     ((Environment *)&_Stack_108,
                      (this->m_var0).
                      super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_2>_>_>
                      .m_ptr);
  pMVar3 = args->a;
  (pMVar3->m_data).m_data[0].m_data[0].m_hi = (pIVar9->m_data).m_data[0].m_data[0].m_hi;
  uVar7 = *(undefined7 *)&(pIVar9->m_data).m_data[0].m_data[0].field_0x1;
  dVar4 = (pIVar9->m_data).m_data[0].m_data[0].m_lo;
  (pMVar3->m_data).m_data[0].m_data[0].m_hasNaN = (pIVar9->m_data).m_data[0].m_data[0].m_hasNaN;
  *(undefined7 *)&(pMVar3->m_data).m_data[0].m_data[0].field_0x1 = uVar7;
  (pMVar3->m_data).m_data[0].m_data[0].m_lo = dVar4;
  (pMVar3->m_data).m_data[1].m_data[0].m_hi = (pIVar9->m_data).m_data[1].m_data[0].m_hi;
  uVar7 = *(undefined7 *)&(pIVar9->m_data).m_data[1].m_data[0].field_0x1;
  dVar4 = (pIVar9->m_data).m_data[1].m_data[0].m_lo;
  (pMVar3->m_data).m_data[1].m_data[0].m_hasNaN = (pIVar9->m_data).m_data[1].m_data[0].m_hasNaN;
  *(undefined7 *)&(pMVar3->m_data).m_data[1].m_data[0].field_0x1 = uVar7;
  (pMVar3->m_data).m_data[1].m_data[0].m_lo = dVar4;
  (pMVar3->m_data).m_data[0].m_data[1].m_hi = (pIVar9->m_data).m_data[0].m_data[1].m_hi;
  uVar7 = *(undefined7 *)&(pIVar9->m_data).m_data[0].m_data[1].field_0x1;
  dVar4 = (pIVar9->m_data).m_data[0].m_data[1].m_lo;
  (pMVar3->m_data).m_data[0].m_data[1].m_hasNaN = (pIVar9->m_data).m_data[0].m_data[1].m_hasNaN;
  *(undefined7 *)&(pMVar3->m_data).m_data[0].m_data[1].field_0x1 = uVar7;
  (pMVar3->m_data).m_data[0].m_data[1].m_lo = dVar4;
  pVVar5 = (pIVar9->m_data).m_data;
  uVar7 = *(undefined7 *)&pVVar5[1].m_data[1].field_0x1;
  dVar4 = (pIVar9->m_data).m_data[1].m_data[1].m_lo;
  pVVar6 = (pMVar3->m_data).m_data;
  pVVar6[1].m_data[1].m_hasNaN = pVVar5[1].m_data[1].m_hasNaN;
  *(undefined7 *)&pVVar6[1].m_data[1].field_0x1 = uVar7;
  (pMVar3->m_data).m_data[1].m_data[1].m_lo = dVar4;
  (pMVar3->m_data).m_data[1].m_data[1].m_hi = (pIVar9->m_data).m_data[1].m_data[1].m_hi;
  Environment::lookup<vkt::shaderexecutor::Void>
            ((Environment *)&_Stack_108,
             (this->m_var1).
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr)
  ;
  Environment::lookup<vkt::shaderexecutor::Void>
            ((Environment *)&_Stack_108,
             (this->m_var2).
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr)
  ;
  Environment::lookup<vkt::shaderexecutor::Void>
            ((Environment *)&_Stack_108,
             (this->m_var3).
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr)
  ;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&_Stack_108);
  return __return_storage_ptr__;
}

Assistant:

IRet						doApply			(const EvalContext&	ctx,
												 const IArgs&		args) const
	{
		Environment	funEnv;
		IArgs&		mutArgs		= const_cast<IArgs&>(args);
		IRet		ret;

		initialize();

		funEnv.bind(*m_var0, args.a);
		funEnv.bind(*m_var1, args.b);
		funEnv.bind(*m_var2, args.c);
		funEnv.bind(*m_var3, args.d);

		{
			EvalContext	funCtx(ctx.format, ctx.floatPrecision, funEnv, ctx.callDepth);

			for (size_t ndx = 0; ndx < m_body.size(); ++ndx)
				m_body[ndx]->execute(funCtx);

			ret = m_ret->evaluate(funCtx);
		}

		// \todo [lauri] Store references instead of values in environment
		const_cast<IArg0&>(mutArgs.a) = funEnv.lookup(*m_var0);
		const_cast<IArg1&>(mutArgs.b) = funEnv.lookup(*m_var1);
		const_cast<IArg2&>(mutArgs.c) = funEnv.lookup(*m_var2);
		const_cast<IArg3&>(mutArgs.d) = funEnv.lookup(*m_var3);

		return ret;
	}